

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viplanner.cpp
# Opt level: O3

int __thiscall
VIPlanner::replan(VIPlanner *this,double allocatedtime,
                 vector<int,_std::allocator<int>_> *solution_stateIDs_V)

{
  int *piVar1;
  int iVar2;
  clock_t cVar3;
  clock_t cVar4;
  long lVar5;
  
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1f])();
  cVar3 = clock();
  cVar4 = clock();
  lVar5 = cVar4 - cVar3;
  while (((double)lVar5 / 1000000.0 < allocatedtime && (0.01 < g_belldelta))) {
    piVar1 = &(this->viPlanner).iteration;
    *piVar1 = *piVar1 + 1;
    g_belldelta = 0.0;
    (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1e])(this);
    iVar2 = (this->viPlanner).iteration;
    if ((iVar2 * -0x3d70a3d7 + 0x51eb850U >> 2 | iVar2 * 0x40000000) < 0x28f5c29) {
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])(this,_stdout,cVar3);
      (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])(this,1,cVar3);
    }
    cVar4 = clock();
    lVar5 = cVar4 - cVar3;
  }
  clock();
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])(this,_stdout,cVar3);
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1a])(this,1,cVar3);
  (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x1b])(this,1);
  return 1;
}

Assistant:

int VIPlanner::replan(double allocatedtime, vector<int>* solution_stateIDs_V)
{
#ifndef ROS
    const char* policy = "policy.txt";
    const char* stat = "stat.txt";
#endif
    FILE* fPolicy = SBPL_FOPEN(policy, "w");
    FILE* fStat = SBPL_FOPEN(stat, "w");

    //initialization
    InitializePlanner();

    //start the timer
    clock_t starttime = clock();

    //--------------iterate-------------------------------
    while (((clock() - starttime) / (double)CLOCKS_PER_SEC) < allocatedtime && g_belldelta > MDP_ERRDELTA) {
        viPlanner.iteration++;

        g_belldelta = 0;
        perform_iteration_forward();

        if (viPlanner.iteration % 100 == 0) {
            PrintStat(stdout, starttime);
            PrintStat(fStat, starttime);
        }
    }
    //------------------------------------------------------------------

    g_runtime = clock() - starttime;

    PrintStat(stdout, starttime);
    PrintStat(fStat, starttime);
    SBPL_FFLUSH(fStat);

    PrintPolicy(fPolicy);

    SBPL_FCLOSE(fPolicy);
    SBPL_FCLOSE(fStat);

    return 1;
}